

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_grouping(lyout *out,lys_node *node)

{
  lys_node_grp *group;
  lys_node *node_local;
  lyout *out_local;
  
  ly_print(out,"%-*s%s\n",0xb,"Grouping: ",node->name);
  ly_print(out,"%-*s%s\n",0xb,"Module: ",node->module->name);
  info_print_text(out,node->dsc,"Desc: ");
  info_print_text(out,node->ref,"Reference: ");
  info_print_flags(out,node->flags,0x38,0);
  info_print_typedef(out,(lys_tpdf *)node[1].name,node->padding[3]);
  info_print_snode(out,node,node->child,"Children:");
  return;
}

Assistant:

static void
info_print_grouping(struct lyout *out, const struct lys_node *node)
{
    struct lys_node_grp *group = (struct lys_node_grp *)node;

    ly_print(out, "%-*s%s\n", INDENT_LEN, "Grouping: ", group->name);
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Module: ", group->module->name);
    info_print_text(out, group->dsc, "Desc: ");
    info_print_text(out, group->ref, "Reference: ");
    info_print_flags(out, group->flags, LYS_STATUS_MASK, 0);
    info_print_typedef(out, group->tpdf, group->tpdf_size);

    info_print_snode(out, (struct lys_node *)group, group->child, "Children:");
}